

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
::Clean(WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
        *this)

{
  if ((this->disableCleanup == false) &&
     (this->recycler->weakReferenceCleanupId != this->lastWeakReferenceCleanupId)) {
    WeaklyReferencedKeyDictionary<Js::DynamicType,Js::DynamicType*,DefaultComparer<Js::DynamicType_const*>,true>
    ::
    Map<JsUtil::WeaklyReferencedKeyDictionary<Js::DynamicType,Js::DynamicType*,DefaultComparer<Js::DynamicType_const*>,true>::Clean()::_lambda(Js::DynamicType*,Js::DynamicType*,Memory::RecyclerWeakReference<Js::DynamicType>const*)_1_>
              ((WeaklyReferencedKeyDictionary<Js::DynamicType,Js::DynamicType*,DefaultComparer<Js::DynamicType_const*>,true>
                *)this);
    this->lastWeakReferenceCleanupId = this->recycler->weakReferenceCleanupId;
  }
  return 0 < this->freeCount;
}

Assistant:

bool Clean()
        {
            if (!disableCleanup && recycler->GetWeakReferenceCleanupId() != this->lastWeakReferenceCleanupId)
            {
                Map([](TKey * key, TValue value, const RecyclerWeakReference<TKey>* weakRef) {});
                this->lastWeakReferenceCleanupId = recycler->GetWeakReferenceCleanupId();
            }

            return freeCount > 0;
        }